

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::CommitAppend
          (RowGroupCollection *this,transaction_t commit_id,idx_t row_start,idx_t count)

{
  RowGroupSegmentTree *pRVar1;
  RowGroup *this_00;
  idx_t row_group_start;
  ulong count_00;
  
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_00 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                      (&pRVar1->super_SegmentTree<duckdb::RowGroup,_true>,row_start);
  while( true ) {
    row_group_start = row_start - (this_00->super_SegmentBase<duckdb::RowGroup>).start;
    count_00 = (this_00->super_SegmentBase<duckdb::RowGroup>).count.
               super___atomic_base<unsigned_long>._M_i - row_group_start;
    if (count <= count_00) {
      count_00 = count;
    }
    RowGroup::CommitAppend(this_00,commit_id,row_group_start,count_00);
    count = count - count_00;
    if (count == 0) break;
    row_start = row_start + count_00;
    pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_00 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                        (&pRVar1->super_SegmentTree<duckdb::RowGroup,_true>,this_00);
  }
  return;
}

Assistant:

void RowGroupCollection::CommitAppend(transaction_t commit_id, idx_t row_start, idx_t count) {
	auto row_group = row_groups->GetSegment(row_start);
	D_ASSERT(row_group);
	idx_t current_row = row_start;
	idx_t remaining = count;
	while (true) {
		idx_t start_in_row_group = current_row - row_group->start;
		idx_t append_count = MinValue<idx_t>(row_group->count - start_in_row_group, remaining);

		row_group->CommitAppend(commit_id, start_in_row_group, append_count);

		current_row += append_count;
		remaining -= append_count;
		if (remaining == 0) {
			break;
		}
		row_group = row_groups->GetNextSegment(row_group);
	}
}